

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::FullyConnectedLayer::calcPropagatedErrors(FullyConnectedLayer *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_t sVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  size_t sVar7;
  float *pfVar8;
  size_t sVar9;
  float fVar10;
  
  sVar1 = this->nInputs;
  if ((this->propagatedErrors)._M_size != sVar1) {
    operator_delete((this->propagatedErrors)._M_data);
    (this->propagatedErrors)._M_size = sVar1;
    pfVar4 = (float *)operator_new(sVar1 * 4);
    (this->propagatedErrors)._M_data = pfVar4;
    if (sVar1 != 0) {
      memset(pfVar4,0,sVar1 * 4);
    }
  }
  pfVar4 = (float *)(this->propagatedErrors)._M_size;
  if (pfVar4 != (float *)0x0) {
    pfVar4 = (this->propagatedErrors)._M_data;
  }
  peVar2 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pfVar5 = (float *)peVar2->_M_size;
  if (pfVar5 != (float *)0x0) {
    pfVar5 = peVar2->_M_data;
  }
  sVar1 = this->nInputs;
  pfVar6 = (float *)(this->localGrad)._M_size;
  if (pfVar6 != (float *)0x0) {
    pfVar6 = (this->localGrad)._M_data;
  }
  if (sVar1 != 0) {
    sVar3 = this->nOutputs;
    sVar7 = 0;
    do {
      if (sVar3 == 0) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = 0.0;
        sVar9 = 0;
        pfVar8 = pfVar5;
        do {
          fVar10 = fVar10 + *pfVar8 * pfVar6[sVar9];
          sVar9 = sVar9 + 1;
          pfVar8 = pfVar8 + sVar1;
        } while (sVar3 != sVar9);
      }
      pfVar4[sVar7] = fVar10;
      sVar7 = sVar7 + 1;
      pfVar5 = pfVar5 + 1;
    } while (sVar7 != sVar1);
  }
  return;
}

Assistant:

void calcPropagatedErrors() {
        if (propagatedErrors.size() != nInputs) {
            propagatedErrors.resize(nInputs);
        }
        // propagated errors are dot products between columns of the
        // weight matrix $w_{kj} and local gradient $\\delta_j$;
        auto e_begin = std::begin(propagatedErrors); // points to e_0
        auto w_begin = std::begin(*weights);         // points to w_00
        auto delta_begin = std::begin(localGrad);    // points to delta_0
        for (size_t j = 0; j < nInputs; ++j) { // for all inputs
            float &e_j = *(e_begin + j);
            e_j = internal::dot(nOutputs, w_begin + j, nInputs, delta_begin, 1);
        }
    }